

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point_Object_State_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Point_Object_State_PDU::Point_Object_State_PDU
          (Point_Object_State_PDU *this,EntityIdentifier *ObjID,EntityIdentifier *RefObjID,
          KUINT16 UpdateNum,ForceID FI,ObjectType *O,WorldCoordinates *Loc,EulerAngles *Ori,
          PointObjectAppearance *P,SimulationIdentifier *ReqID,SimulationIdentifier *RecvID)

{
  ObjectType *O_local;
  ForceID FI_local;
  KUINT16 UpdateNum_local;
  EntityIdentifier *RefObjID_local;
  EntityIdentifier *ObjID_local;
  Point_Object_State_PDU *this_local;
  
  Object_State_Header::Object_State_Header
            (&this->super_Object_State_Header,ObjID,RefObjID,UpdateNum,FI);
  (this->super_Object_State_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Point_Object_State_PDU_0033a9d8;
  DATA_TYPE::ObjectType::ObjectType(&this->m_ObjTyp,O);
  DATA_TYPE::WorldCoordinates::WorldCoordinates(&this->m_Loc,Loc);
  DATA_TYPE::EulerAngles::EulerAngles(&this->m_Ori,Ori);
  DATA_TYPE::PointObjectAppearance::PointObjectAppearance(&this->m_Apperance,P);
  this->m_ui16Padding = 0;
  DATA_TYPE::SimulationIdentifier::SimulationIdentifier(&this->m_ReqID,ReqID);
  DATA_TYPE::SimulationIdentifier::SimulationIdentifier(&this->m_RecvID,RecvID);
  this->m_ui32Padding1 = 0;
  (this->super_Object_State_Header).field_0x4b = 0;
  (this->super_Object_State_Header).super_Header.super_Header6.m_ui8PDUType = '+';
  (this->super_Object_State_Header).super_Header.super_Header6.m_ui16PDULength = 0x58;
  return;
}

Assistant:

Point_Object_State_PDU::Point_Object_State_PDU( const EntityIdentifier & ObjID, const EntityIdentifier & RefObjID , KUINT16 UpdateNum,
        ForceID FI, const ObjectType & O, const WorldCoordinates & Loc, const EulerAngles & Ori,
        const PointObjectAppearance & P, const SimulationIdentifier & ReqID,
        const SimulationIdentifier & RecvID ) :
    Object_State_Header( ObjID, RefObjID, UpdateNum, FI ),
    m_ObjTyp( O ),
    m_Loc( Loc ),
    m_Ori( Ori ),
    m_Apperance( P ),
    m_ui16Padding( 0 ),
    m_ui32Padding1( 0 ),
    m_ReqID( ReqID ),
    m_RecvID( RecvID )
{
    m_ModificationUnion.m_ui8Modifications = 0;
    m_ui8PDUType = PointObjectState_PDU_Type;
    m_ui16PDULength = POINT_OBJECT_STATE_PDU_SIZE;
}